

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

bool out_CreateAssert(AssertionType type,Expression *expr,char *message,uint32_t ofs)

{
  Assertion *__ptr;
  Patch *pPVar1;
  char *pcVar2;
  Assertion *assertion;
  uint32_t ofs_local;
  char *message_local;
  Expression *expr_local;
  AssertionType type_local;
  
  __ptr = (Assertion *)malloc(0x20);
  if (__ptr == (Assertion *)0x0) {
    expr_local._7_1_ = false;
  }
  else {
    pPVar1 = allocpatch(type,expr,ofs);
    __ptr->patch = pPVar1;
    pcVar2 = strdup(message);
    __ptr->message = pcVar2;
    if (__ptr->message == (char *)0x0) {
      free(__ptr);
      expr_local._7_1_ = false;
    }
    else {
      __ptr->next = assertions;
      expr_local._7_1_ = true;
      assertions = __ptr;
    }
  }
  return expr_local._7_1_;
}

Assistant:

bool out_CreateAssert(enum AssertionType type, struct Expression const *expr,
		      char const *message, uint32_t ofs)
{
	struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

	if (!assertion)
		return false;

	assertion->patch = allocpatch(type, expr, ofs);
	assertion->message = strdup(message);
	if (!assertion->message) {
		free(assertion);
		return false;
	}

	assertion->next = assertions;
	assertions = assertion;

	return true;
}